

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlBuildURISafe(xmlChar *URI,xmlChar *base,xmlChar **valPtr)

{
  int iVar1;
  xmlChar *pxVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  xmlURIPtr local_60;
  xmlURIPtr res;
  xmlURIPtr bas;
  xmlURIPtr ref;
  int local_40;
  int out;
  int cur;
  int indx;
  int len;
  int ret;
  xmlChar *val;
  xmlChar **valPtr_local;
  xmlChar *base_local;
  xmlChar *URI_local;
  
  _len = (xmlChar *)0x0;
  bas = (xmlURIPtr)0x0;
  res = (xmlURIPtr)0x0;
  local_60 = (xmlURIPtr)0x0;
  if (valPtr == (xmlChar **)0x0) {
    return 1;
  }
  *valPtr = (xmlChar *)0x0;
  if (URI == (xmlChar *)0x0) {
    return 1;
  }
  val = (xmlChar *)valPtr;
  valPtr_local = (xmlChar **)base;
  base_local = URI;
  if (base == (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(URI);
    if (pxVar2 == (xmlChar *)0x0) {
      return -1;
    }
    *(xmlChar **)val = pxVar2;
    return 0;
  }
  if (*URI == '\0') {
    indx = 0;
  }
  else {
    indx = xmlParseURISafe((char *)URI,&bas);
  }
  if (indx != 0) goto LAB_00170ffe;
  if ((bas != (xmlURIPtr)0x0) && (bas->scheme != (char *)0x0)) {
    _len = xmlStrdup(base_local);
    if (_len == (xmlChar *)0x0) {
      indx = -1;
    }
    goto LAB_00170ffe;
  }
  pxVar2 = xmlStrstr((xmlChar *)valPtr_local,"://");
  if (pxVar2 == (xmlChar *)0x0) {
    xmlFreeURI(bas);
    iVar1 = xmlResolvePath(base_local,(xmlChar *)valPtr_local,(xmlChar **)val);
    return iVar1;
  }
  indx = xmlParseURISafe((char *)valPtr_local,&res);
  if (indx < 0) goto LAB_00170ffe;
  if (indx != 0) {
    if (bas != (xmlURIPtr)0x0) {
      indx = 0;
      _len = xmlSaveUri(bas);
      if (_len == (xmlChar *)0x0) {
        indx = -1;
      }
    }
    goto LAB_00170ffe;
  }
  if (bas == (xmlURIPtr)0x0) {
    if (res->fragment != (char *)0x0) {
      (*xmlFree)(res->fragment);
      res->fragment = (char *)0x0;
    }
    _len = xmlSaveUri(res);
    if (_len == (xmlChar *)0x0) {
      indx = -1;
    }
    goto LAB_00170ffe;
  }
  indx = -1;
  local_60 = xmlCreateURI();
  if (local_60 == (xmlURIPtr)0x0) goto LAB_00170ffe;
  if ((((bas->scheme == (char *)0x0) && (bas->path == (char *)0x0)) &&
      (bas->authority == (char *)0x0)) && ((bas->server == (char *)0x0 && (bas->port == 0)))) {
    if (res->scheme != (char *)0x0) {
      pcVar3 = (*xmlMemStrdup)(res->scheme);
      local_60->scheme = pcVar3;
      if (local_60->scheme == (char *)0x0) goto LAB_00170ffe;
    }
    if (res->authority == (char *)0x0) {
      if (res->server != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(res->server);
        local_60->server = pcVar3;
        if (local_60->server == (char *)0x0) goto LAB_00170ffe;
      }
      if (res->user != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(res->user);
        local_60->user = pcVar3;
        if (local_60->user == (char *)0x0) goto LAB_00170ffe;
      }
      local_60->port = res->port;
    }
    else {
      pcVar3 = (*xmlMemStrdup)(res->authority);
      local_60->authority = pcVar3;
      if (local_60->authority == (char *)0x0) goto LAB_00170ffe;
    }
    if (res->path != (char *)0x0) {
      pcVar3 = (*xmlMemStrdup)(res->path);
      local_60->path = pcVar3;
      if (local_60->path == (char *)0x0) goto LAB_00170ffe;
    }
    if (bas->query_raw == (char *)0x0) {
      if (bas->query != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(bas->query);
        local_60->query = pcVar3;
        pcVar3 = local_60->query;
        goto joined_r0x001709e7;
      }
      if (res->query_raw != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(res->query_raw);
        local_60->query_raw = pcVar3;
        pcVar3 = local_60->query_raw;
        goto joined_r0x001709e7;
      }
      if (res->query != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(res->query);
        local_60->query = pcVar3;
        pcVar3 = local_60->query;
        goto joined_r0x001709e7;
      }
    }
    else {
      pcVar3 = (*xmlMemStrdup)(bas->query_raw);
      local_60->query_raw = pcVar3;
      pcVar3 = local_60->query_raw;
joined_r0x001709e7:
      if (pcVar3 == (char *)0x0) goto LAB_00170ffe;
    }
    if (bas->fragment != (char *)0x0) {
      pcVar3 = (*xmlMemStrdup)(bas->fragment);
      local_60->fragment = pcVar3;
      pcVar3 = local_60->fragment;
joined_r0x00170d9c:
      if (pcVar3 == (char *)0x0) goto LAB_00170ffe;
    }
  }
  else {
    if (bas->scheme != (char *)0x0) {
      _len = xmlSaveUri(bas);
      if (_len != (xmlChar *)0x0) {
        indx = 0;
      }
      goto LAB_00170ffe;
    }
    if (res->scheme != (char *)0x0) {
      pcVar3 = (*xmlMemStrdup)(res->scheme);
      local_60->scheme = pcVar3;
      if (local_60->scheme == (char *)0x0) goto LAB_00170ffe;
    }
    if (bas->query_raw == (char *)0x0) {
      if (bas->query != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(bas->query);
        local_60->query = pcVar3;
        pcVar3 = local_60->query;
        goto joined_r0x00170b08;
      }
    }
    else {
      pcVar3 = (*xmlMemStrdup)(bas->query_raw);
      local_60->query_raw = pcVar3;
      pcVar3 = local_60->query_raw;
joined_r0x00170b08:
      if (pcVar3 == (char *)0x0) goto LAB_00170ffe;
    }
    if (bas->fragment != (char *)0x0) {
      pcVar3 = (*xmlMemStrdup)(bas->fragment);
      local_60->fragment = pcVar3;
      if (local_60->fragment == (char *)0x0) goto LAB_00170ffe;
    }
    if (((bas->authority == (char *)0x0) && (bas->server == (char *)0x0)) && (bas->port == 0)) {
      if (res->authority == (char *)0x0) {
        if ((res->server != (char *)0x0) || (res->port != 0)) {
          if (res->server != (char *)0x0) {
            pcVar3 = (*xmlMemStrdup)(res->server);
            local_60->server = pcVar3;
            if (local_60->server == (char *)0x0) goto LAB_00170ffe;
          }
          if (res->user != (char *)0x0) {
            pcVar3 = (*xmlMemStrdup)(res->user);
            local_60->user = pcVar3;
            if (local_60->user == (char *)0x0) goto LAB_00170ffe;
          }
          local_60->port = res->port;
        }
      }
      else {
        pcVar3 = (*xmlMemStrdup)(res->authority);
        local_60->authority = pcVar3;
        if (local_60->authority == (char *)0x0) goto LAB_00170ffe;
      }
      if ((bas->path != (char *)0x0) && (*bas->path == '/')) {
        pcVar3 = (*xmlMemStrdup)(bas->path);
        local_60->path = pcVar3;
        pcVar3 = local_60->path;
        goto joined_r0x00170d9c;
      }
      cur = 2;
      if (bas->path != (char *)0x0) {
        sVar4 = strlen(bas->path);
        cur = cur + (int)sVar4;
      }
      if (res->path != (char *)0x0) {
        sVar4 = strlen(res->path);
        cur = cur + (int)sVar4;
      }
      pcVar3 = (char *)(*xmlMalloc)((long)cur);
      local_60->path = pcVar3;
      if (local_60->path == (char *)0x0) goto LAB_00170ffe;
      *local_60->path = '\0';
      local_40 = 0;
      ref._4_4_ = 0;
      if (res->path != (char *)0x0) {
        while (res->path[local_40] != '\0') {
          while( true ) {
            bVar5 = false;
            if (res->path[local_40] != '\0') {
              bVar5 = res->path[local_40] != '/';
            }
            if (!bVar5) break;
            local_40 = local_40 + 1;
          }
          if (res->path[local_40] == '\0') break;
          local_40 = local_40 + 1;
          for (; ref._4_4_ < local_40; ref._4_4_ = ref._4_4_ + 1) {
            local_60->path[ref._4_4_] = res->path[ref._4_4_];
          }
        }
      }
      local_60->path[ref._4_4_] = '\0';
      if ((bas->path != (char *)0x0) && (*bas->path != '\0')) {
        out = 0;
        if ((ref._4_4_ == 0) && ((res->server != (char *)0x0 || (res->port != 0)))) {
          ref._4_4_ = 1;
          *local_60->path = '/';
        }
        while (bas->path[out] != '\0') {
          local_60->path[ref._4_4_] = bas->path[out];
          ref._4_4_ = ref._4_4_ + 1;
          out = out + 1;
        }
      }
      local_60->path[ref._4_4_] = '\0';
      xmlNormalizeURIPath(local_60->path);
    }
    else {
      if (bas->authority == (char *)0x0) {
        if (bas->server != (char *)0x0) {
          pcVar3 = (*xmlMemStrdup)(bas->server);
          local_60->server = pcVar3;
          if (local_60->server == (char *)0x0) goto LAB_00170ffe;
        }
        if (bas->user != (char *)0x0) {
          pcVar3 = (*xmlMemStrdup)(bas->user);
          local_60->user = pcVar3;
          if (local_60->user == (char *)0x0) goto LAB_00170ffe;
        }
        local_60->port = bas->port;
      }
      else {
        pcVar3 = (*xmlMemStrdup)(bas->authority);
        local_60->authority = pcVar3;
        if (local_60->authority == (char *)0x0) goto LAB_00170ffe;
      }
      if (bas->path != (char *)0x0) {
        pcVar3 = (*xmlMemStrdup)(bas->path);
        local_60->path = pcVar3;
        pcVar3 = local_60->path;
        goto joined_r0x00170d9c;
      }
    }
  }
  _len = xmlSaveUri(local_60);
  if (_len != (xmlChar *)0x0) {
    indx = 0;
  }
LAB_00170ffe:
  if (bas != (xmlURIPtr)0x0) {
    xmlFreeURI(bas);
  }
  if (res != (xmlURIPtr)0x0) {
    xmlFreeURI(res);
  }
  if (local_60 != (xmlURIPtr)0x0) {
    xmlFreeURI(local_60);
  }
  *(xmlChar **)val = _len;
  return indx;
}

Assistant:

int
xmlBuildURISafe(const xmlChar *URI, const xmlChar *base, xmlChar **valPtr) {
    xmlChar *val = NULL;
    int ret, len, indx, cur, out;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlURIPtr res = NULL;

    if (valPtr == NULL)
        return(1);
    *valPtr = NULL;

    if (URI == NULL)
        return(1);

    if (base == NULL) {
        val = xmlStrdup(URI);
        if (val == NULL)
            return(-1);
        *valPtr = val;
        return(0);
    }

    /*
     * 1) The URI reference is parsed into the potential four components and
     *    fragment identifier, as described in Section 4.3.
     *
     *    NOTE that a completely empty URI is treated by modern browsers
     *    as a reference to "." rather than as a synonym for the current
     *    URI.  Should we do that here?
     */
    if (URI[0] != 0)
        ret = xmlParseURISafe((const char *) URI, &ref);
    else
        ret = 0;
    if (ret != 0)
	goto done;
    if ((ref != NULL) && (ref->scheme != NULL)) {
	/*
	 * The URI is absolute don't modify.
	 */
	val = xmlStrdup(URI);
        if (val == NULL)
            ret = -1;
	goto done;
    }

    /*
     * If base has no scheme or authority, it is assumed to be a
     * filesystem path.
     */
    if (xmlStrstr(base, BAD_CAST "://") == NULL) {
        xmlFreeURI(ref);
        return(xmlResolvePath(URI, base, valPtr));
    }

#if defined(_WIN32) || defined(__CYGWIN__)
    /*
     * Resolve paths with a Windows drive letter as filesystem path
     * even if base has a scheme.
     */
    if ((ref != NULL) && (ref->path != NULL)) {
        int c = ref->path[0];

        if ((((c >= 'A') && (c <= 'Z')) ||
             ((c >= 'a') && (c <= 'z'))) &&
            (ref->path[1] == ':')) {
            xmlFreeURI(ref);
            return(xmlResolvePath(URI, base, valPtr));
        }
    }
#endif

    ret = xmlParseURISafe((const char *) base, &bas);
    if (ret < 0)
        goto done;
    if (ret != 0) {
	if (ref) {
            ret = 0;
	    val = xmlSaveUri(ref);
            if (val == NULL)
                ret = -1;
        }
	goto done;
    }
    if (ref == NULL) {
	/*
	 * the base fragment must be ignored
	 */
	if (bas->fragment != NULL) {
	    xmlFree(bas->fragment);
	    bas->fragment = NULL;
	}
	val = xmlSaveUri(bas);
        if (val == NULL)
            ret = -1;
	goto done;
    }

    /*
     * 2) If the path component is empty and the scheme, authority, and
     *    query components are undefined, then it is a reference to the
     *    current document and we are done.  Otherwise, the reference URI's
     *    query and fragment components are defined as found (or not found)
     *    within the URI reference and not inherited from the base URI.
     *
     *    NOTE that in modern browsers, the parsing differs from the above
     *    in the following aspect:  the query component is allowed to be
     *    defined while still treating this as a reference to the current
     *    document.
     */
    ret = -1;
    res = xmlCreateURI();
    if (res == NULL)
	goto done;
    if ((ref->scheme == NULL) && (ref->path == NULL) &&
	((ref->authority == NULL) && (ref->server == NULL) &&
         (ref->port == PORT_EMPTY))) {
	if (bas->scheme != NULL) {
	    res->scheme = xmlMemStrdup(bas->scheme);
            if (res->scheme == NULL)
                goto done;
        }
	if (bas->authority != NULL) {
	    res->authority = xmlMemStrdup(bas->authority);
            if (res->authority == NULL)
                goto done;
        } else {
	    if (bas->server != NULL) {
		res->server = xmlMemStrdup(bas->server);
                if (res->server == NULL)
                    goto done;
            }
	    if (bas->user != NULL) {
		res->user = xmlMemStrdup(bas->user);
                if (res->user == NULL)
                    goto done;
            }
	    res->port = bas->port;
	}
	if (bas->path != NULL) {
	    res->path = xmlMemStrdup(bas->path);
            if (res->path == NULL)
                goto done;
        }
	if (ref->query_raw != NULL) {
	    res->query_raw = xmlMemStrdup (ref->query_raw);
            if (res->query_raw == NULL)
                goto done;
        } else if (ref->query != NULL) {
	    res->query = xmlMemStrdup(ref->query);
            if (res->query == NULL)
                goto done;
        } else if (bas->query_raw != NULL) {
	    res->query_raw = xmlMemStrdup(bas->query_raw);
            if (res->query_raw == NULL)
                goto done;
        } else if (bas->query != NULL) {
	    res->query = xmlMemStrdup(bas->query);
            if (res->query == NULL)
                goto done;
        }
	if (ref->fragment != NULL) {
	    res->fragment = xmlMemStrdup(ref->fragment);
            if (res->fragment == NULL)
                goto done;
        }
	goto step_7;
    }

    /*
     * 3) If the scheme component is defined, indicating that the reference
     *    starts with a scheme name, then the reference is interpreted as an
     *    absolute URI and we are done.  Otherwise, the reference URI's
     *    scheme is inherited from the base URI's scheme component.
     */
    if (ref->scheme != NULL) {
	val = xmlSaveUri(ref);
        if (val != NULL)
            ret = 0;
	goto done;
    }
    if (bas->scheme != NULL) {
	res->scheme = xmlMemStrdup(bas->scheme);
        if (res->scheme == NULL)
            goto done;
    }

    if (ref->query_raw != NULL) {
	res->query_raw = xmlMemStrdup(ref->query_raw);
        if (res->query_raw == NULL)
            goto done;
    } else if (ref->query != NULL) {
	res->query = xmlMemStrdup(ref->query);
        if (res->query == NULL)
            goto done;
    }
    if (ref->fragment != NULL) {
	res->fragment = xmlMemStrdup(ref->fragment);
        if (res->fragment == NULL)
            goto done;
    }

    /*
     * 4) If the authority component is defined, then the reference is a
     *    network-path and we skip to step 7.  Otherwise, the reference
     *    URI's authority is inherited from the base URI's authority
     *    component, which will also be undefined if the URI scheme does not
     *    use an authority component.
     */
    if ((ref->authority != NULL) || (ref->server != NULL) ||
         (ref->port != PORT_EMPTY)) {
	if (ref->authority != NULL) {
	    res->authority = xmlMemStrdup(ref->authority);
            if (res->authority == NULL)
                goto done;
        } else {
            if (ref->server != NULL) {
                res->server = xmlMemStrdup(ref->server);
                if (res->server == NULL)
                    goto done;
            }
	    if (ref->user != NULL) {
		res->user = xmlMemStrdup(ref->user);
                if (res->user == NULL)
                    goto done;
            }
            res->port = ref->port;
	}
	if (ref->path != NULL) {
	    res->path = xmlMemStrdup(ref->path);
            if (res->path == NULL)
                goto done;
        }
	goto step_7;
    }
    if (bas->authority != NULL) {
	res->authority = xmlMemStrdup(bas->authority);
        if (res->authority == NULL)
            goto done;
    } else if ((bas->server != NULL) || (bas->port != PORT_EMPTY)) {
	if (bas->server != NULL) {
	    res->server = xmlMemStrdup(bas->server);
            if (res->server == NULL)
                goto done;
        }
	if (bas->user != NULL) {
	    res->user = xmlMemStrdup(bas->user);
            if (res->user == NULL)
                goto done;
        }
	res->port = bas->port;
    }

    /*
     * 5) If the path component begins with a slash character ("/"), then
     *    the reference is an absolute-path and we skip to step 7.
     */
    if ((ref->path != NULL) && (ref->path[0] == '/')) {
	res->path = xmlMemStrdup(ref->path);
        if (res->path == NULL)
            goto done;
	goto step_7;
    }


    /*
     * 6) If this step is reached, then we are resolving a relative-path
     *    reference.  The relative path needs to be merged with the base
     *    URI's path.  Although there are many ways to do this, we will
     *    describe a simple method using a separate string buffer.
     *
     * Allocate a buffer large enough for the result string.
     */
    len = 2; /* extra / and 0 */
    if (ref->path != NULL)
	len += strlen(ref->path);
    if (bas->path != NULL)
	len += strlen(bas->path);
    res->path = xmlMalloc(len);
    if (res->path == NULL)
	goto done;
    res->path[0] = 0;

    /*
     * a) All but the last segment of the base URI's path component is
     *    copied to the buffer.  In other words, any characters after the
     *    last (right-most) slash character, if any, are excluded.
     */
    cur = 0;
    out = 0;
    if (bas->path != NULL) {
	while (bas->path[cur] != 0) {
	    while ((bas->path[cur] != 0) && (bas->path[cur] != '/'))
		cur++;
	    if (bas->path[cur] == 0)
		break;

	    cur++;
	    while (out < cur) {
		res->path[out] = bas->path[out];
		out++;
	    }
	}
    }
    res->path[out] = 0;

    /*
     * b) The reference's path component is appended to the buffer
     *    string.
     */
    if (ref->path != NULL && ref->path[0] != 0) {
	indx = 0;
	/*
	 * Ensure the path includes a '/'
	 */
	if ((out == 0) && ((bas->server != NULL) || bas->port != PORT_EMPTY))
	    res->path[out++] = '/';
	while (ref->path[indx] != 0) {
	    res->path[out++] = ref->path[indx++];
	}
    }
    res->path[out] = 0;

    /*
     * Steps c) to h) are really path normalization steps
     */
    xmlNormalizeURIPath(res->path);

step_7:

    /*
     * 7) The resulting URI components, including any inherited from the
     *    base URI, are recombined to give the absolute form of the URI
     *    reference.
     */
    val = xmlSaveUri(res);
    if (val != NULL)
        ret = 0;

done:
    if (ref != NULL)
	xmlFreeURI(ref);
    if (bas != NULL)
	xmlFreeURI(bas);
    if (res != NULL)
	xmlFreeURI(res);
    *valPtr = val;
    return(ret);
}